

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall
helics::apps::Connector::scanPotentialInterfaceTemplates
          (Connector *this,ConnectionsList *possibleConnections)

{
  pointer pTVar1;
  bool bVar2;
  size_t sVar3;
  pointer pTVar4;
  string_view interfaceName;
  string_view interfaceName_00;
  string_view interfaceName_01;
  string_view testString;
  string_view testString_00;
  string_view testString_01;
  string possibility;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  check;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  
  pTVar4 = (possibleConnections->potentialInputTemplates).
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (possibleConnections->potentialInputTemplates).
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar4 != pTVar1) {
    do {
      if ((pTVar4->combinations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] != 0) {
        sVar3 = 0;
        do {
          TemplateMatcher::instantiateTemplate_abi_cxx11_(&possibility,pTVar4,sVar3);
          interfaceName._M_str = possibility._M_dataplus._M_p;
          interfaceName._M_len = possibility._M_string_length;
          bVar2 = checkPotentialConnection
                            (this,interfaceName,&possibleConnections->tagCodes,
                             &possibleConnections->pubs,&possibleConnections->potentialPubs,
                             &possibleConnections->potentialPublicationTemplates,
                             &possibleConnections->aliases);
          if (bVar2) {
            testString._M_str = possibility._M_dataplus._M_p;
            testString._M_len = possibility._M_string_length;
            TemplateMatcher::isTemplateMatch(&check,pTVar4,testString);
            if (check.
                super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                ._M_payload.
                super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_engaged == true) {
              local_48._M_len =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_len;
              local_48._M_str =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_str;
              local_58._M_len =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_len;
              local_58._M_str =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_str;
              local_68._M_len =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                   super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_len;
              local_68._M_str =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                   super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_str;
              std::
              vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              ::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                        ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                          *)&pTVar4->usedTemplates,&local_48,&local_58,&local_68);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)possibility._M_dataplus._M_p != &possibility.field_2) {
            operator_delete(possibility._M_dataplus._M_p,
                            possibility.field_2._M_allocated_capacity + 1);
          }
          sVar3 = sVar3 + 1;
        } while (sVar3 < (pTVar4->combinations).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1]);
      }
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar1);
  }
  pTVar4 = (possibleConnections->potentialPublicationTemplates).
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (possibleConnections->potentialPublicationTemplates).
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar4 != pTVar1) {
    do {
      if ((pTVar4->combinations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] != 0) {
        sVar3 = 0;
        do {
          TemplateMatcher::instantiateTemplate_abi_cxx11_(&possibility,pTVar4,sVar3);
          interfaceName_00._M_str = possibility._M_dataplus._M_p;
          interfaceName_00._M_len = possibility._M_string_length;
          bVar2 = checkPotentialConnection
                            (this,interfaceName_00,&possibleConnections->tagCodes,
                             &possibleConnections->inputs,&possibleConnections->potentialInputs,
                             &possibleConnections->potentialInputTemplates,
                             &possibleConnections->aliases);
          if (bVar2) {
            testString_00._M_str = possibility._M_dataplus._M_p;
            testString_00._M_len = possibility._M_string_length;
            TemplateMatcher::isTemplateMatch(&check,pTVar4,testString_00);
            if (check.
                super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                ._M_payload.
                super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_engaged == true) {
              local_78._M_len =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_len;
              local_78._M_str =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_str;
              local_88._M_len =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_len;
              local_88._M_str =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_str;
              local_98._M_len =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                   super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_len;
              local_98._M_str =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                   super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_str;
              std::
              vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              ::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                        ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                          *)&pTVar4->usedTemplates,&local_78,&local_88,&local_98);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)possibility._M_dataplus._M_p != &possibility.field_2) {
            operator_delete(possibility._M_dataplus._M_p,
                            possibility.field_2._M_allocated_capacity + 1);
          }
          sVar3 = sVar3 + 1;
        } while (sVar3 < (pTVar4->combinations).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1]);
      }
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar1);
  }
  pTVar4 = (possibleConnections->potentialEndpointTemplates).
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (possibleConnections->potentialEndpointTemplates).
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar4 != pTVar1) {
    do {
      if ((pTVar4->combinations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] != 0) {
        sVar3 = 0;
        do {
          TemplateMatcher::instantiateTemplate_abi_cxx11_(&possibility,pTVar4,sVar3);
          interfaceName_01._M_str = possibility._M_dataplus._M_p;
          interfaceName_01._M_len = possibility._M_string_length;
          bVar2 = checkPotentialConnection
                            (this,interfaceName_01,&possibleConnections->tagCodes,
                             &possibleConnections->endpoints,
                             &possibleConnections->potentialEndpoints,
                             &possibleConnections->potentialEndpointTemplates,
                             &possibleConnections->aliases);
          if (bVar2) {
            testString_01._M_str = possibility._M_dataplus._M_p;
            testString_01._M_len = possibility._M_string_length;
            TemplateMatcher::isTemplateMatch(&check,pTVar4,testString_01);
            if (check.
                super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                ._M_payload.
                super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_engaged == true) {
              local_a8._M_len =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_len;
              local_a8._M_str =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_str;
              local_b8._M_len =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_len;
              local_b8._M_str =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_str;
              local_c8._M_len =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                   super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_len;
              local_c8._M_str =
                   check.
                   super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                   ._M_payload.
                   super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_payload._M_value.
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                   super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl._M_str;
              std::
              vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              ::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                        ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                          *)&pTVar4->usedTemplates,&local_a8,&local_b8,&local_c8);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)possibility._M_dataplus._M_p != &possibility.field_2) {
            operator_delete(possibility._M_dataplus._M_p,
                            possibility.field_2._M_allocated_capacity + 1);
          }
          sVar3 = sVar3 + 1;
        } while (sVar3 < (pTVar4->combinations).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1]);
      }
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar1);
  }
  return;
}

Assistant:

void Connector::scanPotentialInterfaceTemplates(ConnectionsList& possibleConnections)
{
    /** now run through the potential interface templates as if they were directly listed*/
    for (auto& inpTemplate : possibleConnections.potentialInputTemplates) {
        for (std::size_t ii = 0; ii < inpTemplate.possibilitiesCount(); ++ii) {
            const std::string possibility = inpTemplate.instantiateTemplate(ii);
            if (checkPotentialConnection(possibility,
                                         possibleConnections.tagCodes,
                                         possibleConnections.pubs,
                                         possibleConnections.potentialPubs,
                                         possibleConnections.potentialPublicationTemplates,
                                         possibleConnections.aliases)) {
                auto check = inpTemplate.isTemplateMatch(possibility);
                if (check) {
                    inpTemplate.setAsUsed(*check);
                }
            }
        }
    }
    for (auto& pubTemplate : possibleConnections.potentialPublicationTemplates) {
        for (std::size_t ii = 0; ii < pubTemplate.possibilitiesCount(); ++ii) {
            const std::string possibility = pubTemplate.instantiateTemplate(ii);
            if (checkPotentialConnection(possibility,
                                         possibleConnections.tagCodes,
                                         possibleConnections.inputs,
                                         possibleConnections.potentialInputs,
                                         possibleConnections.potentialInputTemplates,
                                         possibleConnections.aliases)) {
                auto check = pubTemplate.isTemplateMatch(possibility);
                if (check) {
                    pubTemplate.setAsUsed(*check);
                }
            }
        }
    }
    for (auto& endTemplate : possibleConnections.potentialEndpointTemplates) {
        for (std::size_t ii = 0; ii < endTemplate.possibilitiesCount(); ++ii) {
            const std::string possibility = endTemplate.instantiateTemplate(ii);
            if (checkPotentialConnection(possibility,
                                         possibleConnections.tagCodes,
                                         possibleConnections.endpoints,
                                         possibleConnections.potentialEndpoints,
                                         possibleConnections.potentialEndpointTemplates,
                                         possibleConnections.aliases)) {
                auto check = endTemplate.isTemplateMatch(possibility);
                if (check) {
                    endTemplate.setAsUsed(*check);
                }
            }
        }
    }
}